

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O3

SIZE_T ObtainCurrentThreadIdImpl(CPalThread *pCurrentThread,char *callingFuncName)

{
  DWORD DVar1;
  SIZE_T SVar2;
  
  if (pCurrentThread == (CPalThread *)0x0) {
    DVar1 = GetCurrentThreadId();
    SVar2 = (SIZE_T)DVar1;
  }
  else {
    SVar2 = pCurrentThread->m_threadId;
  }
  if (SVar2 == 0) {
    fprintf(_stderr,"] %s %s:%d","ObtainCurrentThreadIdImpl",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cs.cpp"
            ,0xbf);
    fprintf(_stderr,"Expression: 0 != threadId\n");
  }
  return SVar2;
}

Assistant:

static SIZE_T ObtainCurrentThreadIdImpl(CPalThread *pCurrentThread, const char *callingFuncName)
{
    SIZE_T threadId;
    if(pCurrentThread)
    {
        threadId = pCurrentThread->GetThreadId();
    }
    else
    {
        threadId = GetCurrentThreadId();
        CS_TRACE("Early %s, no pthread data, getting TID internally\n", callingFuncName);
    }
    _ASSERTE(0 != threadId);

    return threadId;
}